

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O1

type effolkronium::
     basic_random_base<effolkronium::basic_random_thread_local<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_effolkronium::seeder_default,_std::uniform_int_distribution,_std::uniform_real_distribution,_std::bernoulli_distribution>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_effolkronium::seeder_default,_std::uniform_int_distribution,_std::uniform_real_distribution,_std::bernoulli_distribution>
     ::get<int>(int from,int to)

{
  result_type_conflict1 rVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *__urng;
  uniform_int_distribution<int> local_10;
  
  local_10._M_param._M_a = to;
  local_10._M_param._M_b = from;
  if (from < to) {
    local_10._M_param._M_a = from;
    local_10._M_param._M_b = to;
  }
  __urng = basic_random_thread_local<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_effolkronium::seeder_default,_std::uniform_int_distribution,_std::uniform_real_distribution,_std::bernoulli_distribution>
           ::engine_instance();
  rVar1 = std::uniform_int_distribution<int>::operator()(&local_10,__urng,&local_10._M_param);
  return rVar1;
}

Assistant:

static typename std::enable_if<details::is_uniform_int<T>::value
            , T>::type get( T from = (std::numeric_limits<T>::min)( ),
                            T to = (std::numeric_limits<T>::max)( ) ) {
            if( from < to ) // Allow range from higher to lower
                return IntegerDist<T>{ from, to }( engine_instance( ) );
            return IntegerDist<T>{ to, from }( engine_instance( ) );
        }